

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_swap(void *p,void *q,size_t sz)

{
  undefined4 uVar1;
  undefined8 uVar2;
  stb__8 temp_1;
  stb__4 temp;
  char buffer [256];
  ulong local_20;
  size_t sz_local;
  void *q_local;
  void *p_local;
  
  if (p != q) {
    if (sz == 4) {
      uVar1 = *p;
      *(undefined4 *)p = *q;
      *(undefined4 *)q = uVar1;
    }
    else {
      local_20 = sz;
      sz_local = (size_t)q;
      q_local = p;
      if (sz == 8) {
        uVar2 = *p;
        *(undefined8 *)p = *q;
        *(undefined8 *)q = uVar2;
      }
      else {
        for (; 0x100 < local_20; local_20 = local_20 - 0x100) {
          stb_swap(q_local,(void *)sz_local,0x100);
          q_local = (void *)((long)q_local + 0x100);
          sz_local = sz_local + 0x100;
        }
        memcpy(temp_1.d + 4,q_local,local_20);
        memcpy(q_local,(void *)sz_local,local_20);
        memcpy((void *)sz_local,temp_1.d + 4,local_20);
      }
    }
  }
  return;
}

Assistant:

void stb_swap(void *p, void *q, size_t sz)
{
   char buffer[256];
   if (p == q) return;
   if (sz == 4) {
      stb__4 temp    = * ( stb__4 *) p;
      * (stb__4 *) p = * ( stb__4 *) q;
      * (stb__4 *) q = temp;
      return;
   } else if (sz == 8) {
      stb__8 temp    = * ( stb__8 *) p;
      * (stb__8 *) p = * ( stb__8 *) q;
      * (stb__8 *) q = temp;
      return;
   }

   while (sz > sizeof(buffer)) {
      stb_swap(p, q, sizeof(buffer));
      p = (char *) p + sizeof(buffer);
      q = (char *) q + sizeof(buffer);
      sz -= sizeof(buffer);
   }

   memcpy(buffer, p     , sz);
   memcpy(p     , q     , sz);
   memcpy(q     , buffer, sz);
}